

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O3

void __thiscall
Js::FunctionExecutionStateMachine::CommitExecutedIterations
          (FunctionExecutionStateMachine *this,uint16 *limit,uint executedIterations)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  Type TVar4;
  undefined4 *puVar5;
  ushort uVar6;
  uint uVar7;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x31e,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) goto LAB_00780799;
    *puVar5 = 0;
  }
  if ((&this->profilingInterpreter1Limit != limit && &this->simpleJitLimit != limit) &&
      ((&this->autoProfilingInterpreter1Limit != limit && &this->profilingInterpreter0Limit != limit
       ) && (&this->autoProfilingInterpreter0Limit != limit && &this->interpreterLimit != limit))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x325,
                                "(&limit == &interpreterLimit || &limit == &autoProfilingInterpreter0Limit || &limit == &profilingInterpreter0Limit || &limit == &autoProfilingInterpreter1Limit || &limit == &simpleJitLimit || &limit == &profilingInterpreter1Limit)"
                                ,
                                "&limit == &interpreterLimit || &limit == &autoProfilingInterpreter0Limit || &limit == &profilingInterpreter0Limit || &limit == &autoProfilingInterpreter1Limit || &limit == &simpleJitLimit || &limit == &profilingInterpreter1Limit"
                               );
    if (!bVar3) goto LAB_00780799;
    *puVar5 = 0;
  }
  uVar7 = (uint)*limit;
  if (executedIterations < *limit) {
    uVar7 = executedIterations;
  }
  uVar1 = this->fullJitThreshold;
  uVar6 = (ushort)uVar7;
  if (uVar1 < uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x328,"(fullJitThreshold >= clampedExecutedIterations)",
                                "fullJitThreshold >= clampedExecutedIterations");
    if (!bVar3) {
LAB_00780799:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    uVar1 = this->fullJitThreshold;
  }
  this->fullJitThreshold = uVar1 - uVar6;
  *limit = *limit - uVar6;
  VerifyExecutionModeLimits(this);
  if ((&this->profilingInterpreter0Limit == limit) ||
     ((byte)(~DAT_015a4e4c & &this->simpleJitLimit == limit |
            &this->profilingInterpreter1Limit == limit) == 1)) {
    TVar4 = 0xffff;
    if (!CARRY2(uVar6,this->committedProfiledIterations)) {
      TVar4 = uVar6 + this->committedProfiledIterations;
    }
    this->committedProfiledIterations = TVar4;
  }
  return;
}

Assistant:

void FunctionExecutionStateMachine::CommitExecutedIterations(uint16 &limit, const uint executedIterations)
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(
            &limit == &interpreterLimit ||
            &limit == &autoProfilingInterpreter0Limit ||
            &limit == &profilingInterpreter0Limit ||
            &limit == &autoProfilingInterpreter1Limit ||
            &limit == &simpleJitLimit ||
            &limit == &profilingInterpreter1Limit);

        const uint16 clampedExecutedIterations = executedIterations >= limit ? limit : static_cast<uint16>(executedIterations);
        Assert(fullJitThreshold >= clampedExecutedIterations);
        fullJitThreshold -= clampedExecutedIterations;
        limit -= clampedExecutedIterations;
        VerifyExecutionModeLimits();

        if (&limit == &profilingInterpreter0Limit ||
            (!CONFIG_FLAG(NewSimpleJit) && &limit == &simpleJitLimit) ||
            &limit == &profilingInterpreter1Limit)
        {
            const uint16 newCommittedProfiledIterations = committedProfiledIterations + clampedExecutedIterations;
            committedProfiledIterations =
                newCommittedProfiledIterations >= committedProfiledIterations ? newCommittedProfiledIterations : UINT16_MAX;
        }
    }